

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void * mwCalloc(size_t a,size_t b,char *file,int line)

{
  size_t size;
  void *p;
  int line_local;
  char *file_local;
  size_t b_local;
  size_t a_local;
  
  a_local = (size_t)mwMalloc(a * b,file,line);
  if ((void *)a_local == (void *)0x0) {
    a_local = 0;
  }
  else {
    memset((void *)a_local,0,a * b);
  }
  return (void *)a_local;
}

Assistant:

void *mwCalloc(size_t a, size_t b, const char *file, int line)
{
	void *p;
	size_t size = a * b;
	p = mwMalloc(size, file, line);
	if (p == NULL) {
		return NULL;
	}
	memset(p, 0, size);
	return p;
}